

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void mg_add_conn(mg_mgr *mgr,mg_connection *c)

{
  mg_connection *pmVar1;
  
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_add_conn");
    cs_log_printf("%p %p",mgr,c);
  }
  c->mgr = mgr;
  pmVar1 = mgr->active_connections;
  c->next = pmVar1;
  mgr->active_connections = c;
  c->prev = (mg_connection *)0x0;
  if (pmVar1 != (mg_connection *)0x0) {
    pmVar1->prev = c;
  }
  return;
}

Assistant:

MG_INTERNAL void mg_add_conn(struct mg_mgr *mgr, struct mg_connection *c) {
    DBG(("%p %p", mgr, c));
    c->mgr = mgr;
    c->next = mgr->active_connections;
    mgr->active_connections = c;
    c->prev = NULL;
    if (c->next != NULL) c->next->prev = c;
    mg_ev_mgr_add_conn(c);
}